

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O0

void __thiscall Plane::Init(Plane *this,float *verts,int numVerts)

{
  float *pfVar1;
  int local_48;
  int local_44;
  int curVert;
  int i;
  float *t;
  float *v [3];
  int numVerts_local;
  float *verts_local;
  Plane *this_local;
  
  if (2 < numVerts) {
    local_48 = 1;
    for (local_44 = 1; local_44 < numVerts; local_44 = local_44 + 1) {
      pfVar1 = verts + local_44 * 3;
      if (((0.001 < ABS(*pfVar1 - *v[(long)(local_48 + -1) + -1])) ||
          (0.001 < ABS(pfVar1[1] - v[(long)(local_48 + -1) + -1][1]))) ||
         (0.001 < ABS(pfVar1[2] - v[(long)(local_48 + -1) + -1][2]))) {
        v[(long)local_48 + -1] = pfVar1;
        local_48 = local_48 + 1;
      }
      if (local_48 == 3) break;
    }
    if (local_48 == 3) {
      v[2]._4_4_ = numVerts;
      Init(this,verts,v[0],v[1]);
    }
  }
  return;
}

Assistant:

void Plane::Init(float *verts, int numVerts)
{
   float *v[3], *t;
   int i, curVert;

   if (numVerts < 3) return;

   curVert = 1;
   v[0] = verts + 0;
   for (i = 1; i < numVerts; i++)
   {
      t = verts + (i * 3);
      if (FNOTEQUAL(t[0], v[curVert - 1][0]) || FNOTEQUAL(t[1], v[curVert - 1][1]) || FNOTEQUAL(t[2], v[curVert - 1][2]))
      {
         v[curVert] = t;
         curVert++;
      }
      if (curVert == 3) break;
   }

   if (curVert != 3)
   {
      // degenerate triangle, no valid normal
      return;
   }

   Init(v[0], v[1], v[2]);
}